

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_pool.c
# Opt level: O0

RAND_POOL * ossl_rand_pool_attach(uchar *buffer,size_t len,size_t entropy)

{
  size_t sVar1;
  char *in_RDX;
  char *in_RSI;
  uchar *in_RDI;
  RAND_POOL *pool;
  RAND_POOL *local_8;
  
  local_8 = (RAND_POOL *)CRYPTO_zalloc((size_t)in_RDI,in_RSI,(int)((ulong)in_RDX >> 0x20));
  if (local_8 == (RAND_POOL *)0x0) {
    ERR_new();
    ERR_set_debug((char *)in_RDI,(int)((ulong)in_RSI >> 0x20),in_RDX);
    ERR_set_error(0x24,0xc0100,(char *)0x0);
    local_8 = (RAND_POOL *)0x0;
  }
  else {
    local_8->buffer = in_RDI;
    local_8->len = (size_t)in_RSI;
    local_8->attached = 1;
    sVar1 = local_8->len;
    local_8->alloc_len = sVar1;
    local_8->max_len = sVar1;
    local_8->min_len = sVar1;
    local_8->entropy = (size_t)in_RDX;
  }
  return local_8;
}

Assistant:

RAND_POOL *ossl_rand_pool_attach(const unsigned char *buffer, size_t len,
                                 size_t entropy)
{
    RAND_POOL *pool = OPENSSL_zalloc(sizeof(*pool));

    if (pool == NULL) {
        ERR_raise(ERR_LIB_RAND, ERR_R_MALLOC_FAILURE);
        return NULL;
    }

    /*
     * The const needs to be cast away, but attached buffers will not be
     * modified (in contrary to allocated buffers which are zeroed and
     * freed in the end).
     */
    pool->buffer = (unsigned char *) buffer;
    pool->len = len;

    pool->attached = 1;

    pool->min_len = pool->max_len = pool->alloc_len = pool->len;
    pool->entropy = entropy;

    return pool;
}